

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t readl_bfr(Btor2Parser *bfr)

{
  int32_t iVar1;
  int iVar2;
  Btor2Line *pBVar3;
  char *__s1;
  Btor2Line *pBVar4;
  Btor2Parser *in_RDI;
  Btor2Line *LINE_67;
  Btor2Line *LINE_66;
  Btor2Line *LINE_65;
  Btor2Line *LINE_64;
  Btor2Line *LINE_63;
  Btor2Line *LINE_62;
  Btor2Line *LINE_61;
  Btor2Line *LINE_60;
  Btor2Line *LINE_59;
  Btor2Line *LINE_58;
  Btor2Line *LINE_57;
  Btor2Line *LINE_56;
  Btor2Line *LINE_55;
  Btor2Line *LINE_54;
  Btor2Line *LINE_53;
  Btor2Line *LINE_52;
  Btor2Line *LINE_51;
  Btor2Line *LINE_50;
  Btor2Line *LINE_49;
  Btor2Line *LINE_48;
  Btor2Line *LINE_47;
  Btor2Line *LINE_46;
  Btor2Line *LINE_45;
  Btor2Line *LINE_44;
  Btor2Line *LINE_43;
  Btor2Line *LINE_42;
  Btor2Line *LINE_41;
  Btor2Line *LINE_40;
  Btor2Line *LINE_39;
  Btor2Line *LINE_38;
  Btor2Line *LINE_37;
  Btor2Line *LINE_36;
  Btor2Line *LINE_35;
  Btor2Line *LINE_34;
  Btor2Line *LINE_33;
  Btor2Line *LINE_32;
  Btor2Line *LINE_31;
  Btor2Line *LINE_30;
  Btor2Line *LINE_29;
  Btor2Line *LINE_28;
  Btor2Line *LINE_27;
  Btor2Line *LINE_26;
  Btor2Line *LINE_25;
  Btor2Line *LINE_24;
  Btor2Line *LINE_23;
  Btor2Line *LINE_22;
  Btor2Line *LINE_21;
  Btor2Line *LINE_20;
  Btor2Line *LINE_19;
  Btor2Line *LINE_18;
  Btor2Line *LINE_17;
  Btor2Line *LINE_16;
  Btor2Line *LINE_15;
  Btor2Line *LINE_14;
  Btor2Line *LINE_13;
  Btor2Line *LINE_12;
  Btor2Line *LINE_11;
  Btor2Line *LINE_10;
  Btor2Line *LINE_9;
  Btor2Line *LINE_8;
  Btor2Line *LINE_7;
  Btor2Line *LINE_6;
  Btor2Line *LINE_5;
  Btor2Line *LINE_4;
  Btor2Line *LINE_3;
  Btor2Line *LINE_2;
  Btor2Line *LINE_1;
  Btor2Line *LINE;
  int32_t ch;
  int64_t id;
  int64_t lineno;
  char *tag;
  Btor2Parser *in_stack_fffffffffffffda8;
  Btor2Line *in_stack_fffffffffffffdb0;
  Btor2Parser *in_stack_fffffffffffffdb8;
  Btor2Line *in_stack_fffffffffffffdc0;
  Btor2Parser *in_stack_fffffffffffffdc8;
  Btor2Parser *in_stack_fffffffffffffdd0;
  Btor2Line *in_stack_fffffffffffffde0;
  Btor2Parser *in_stack_fffffffffffffde8;
  Btor2Line *in_stack_fffffffffffffe00;
  Btor2Parser *in_stack_fffffffffffffe08;
  long local_28;
  
  while( true ) {
    do {
      do {
        iVar1 = getc_bfr((Btor2Parser *)in_stack_fffffffffffffdb0);
      } while (iVar1 == 0x20);
      if (iVar1 == -1) {
        return 0;
      }
    } while (iVar1 == 10);
    if (iVar1 == 9) {
      iVar1 = perr_bfr(in_RDI,"unexpected tab character at start of line");
      return iVar1;
    }
    if (iVar1 != 0x3b) break;
    iVar1 = skip_comment(in_stack_fffffffffffffda8);
    if (iVar1 == 0) {
      return 0;
    }
  }
  ungetc_bfr(in_RDI,iVar1);
  iVar1 = parse_id_bfr(in_stack_fffffffffffffdc8,&in_stack_fffffffffffffdc0->id);
  if (iVar1 == 0) {
    return 0;
  }
  iVar1 = getc_bfr((Btor2Parser *)in_stack_fffffffffffffdb0);
  if (iVar1 != 0x20) {
    iVar1 = perr_bfr(in_RDI,"expected space after id");
    return iVar1;
  }
  if (local_28 < in_RDI->ntable) {
    pBVar3 = id2line_bfr(in_RDI,local_28);
    if (pBVar3 != (Btor2Line *)0x0) {
      iVar1 = perr_bfr(in_RDI,"id already defined");
      return iVar1;
    }
    iVar1 = perr_bfr(in_RDI,"id out-of-order");
    return iVar1;
  }
  __s1 = parse_tag(in_stack_fffffffffffffda8);
  if (__s1 == (char *)0x0) {
    return 0;
  }
  pBVar3 = (Btor2Line *)(ulong)((int)*__s1 - 0x61);
  switch(pBVar3) {
  case (Btor2Line *)0x0:
    iVar2 = strcmp(__s1,"add");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1019ee);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"and");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x101ad4);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x1:
    iVar2 = strcmp(__s1,"bad");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constraint_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x2:
    iVar2 = strcmp(__s1,"constraint");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constraint_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"concat");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x101d90);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"const");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"constd");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"consth");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x3:
    iVar2 = strcmp(__s1,"dec");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10212d);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x4:
    iVar2 = strcmp(__s1,"eq");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102218);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x5:
    iVar2 = strcmp(__s1,"fair");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constraint_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x8:
    iVar2 = strcmp(__s1,"implies");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1023ee);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"iff");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1024d4);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"inc");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1025ba);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"init");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_init_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"input");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_input_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ite");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_ternary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10286c);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x9:
    iVar2 = strcmp(__s1,"justice");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_justice_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0xc:
    iVar2 = strcmp(__s1,"mul");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102a42);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0xd:
    iVar2 = strcmp(__s1,"nand");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102b2d);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"neq");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102c13);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"neg");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102cf9);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"next");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_next_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"nor");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102ec5);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"not");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x102fab);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0xe:
    iVar2 = strcmp(__s1,"one");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ones");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"or");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103262);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"output");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constraint_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x11:
    iVar2 = strcmp(__s1,"read");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103433);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"redand");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103519);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"redor");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1035ff);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"redxor");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_unary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1036e5);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"rol");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1037cb);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ror");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1038b1);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x12:
    iVar2 = strcmp(__s1,"saddo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10399c);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sext");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_ext_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sgt");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103b68);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sgte");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103c4e);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sdiv");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103d34);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sdivo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103e1a);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"slice");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_slice_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sll");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x103fe6);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"slt");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1040cc);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"slte");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1041b2);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sort");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_sort_bfr(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"smod");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10437e);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"smulo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104464);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ssubo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10454a);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sra");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104630);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"srl");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104716);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"srem");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1047fc);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"state");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_input_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"sub");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1049c2);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x14:
    iVar2 = strcmp(__s1,"uaddo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104a9e);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"udiv");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104b75);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"uext");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_ext_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ugt");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104d23);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ugte");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104dfa);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ult");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104ed1);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"ulte");
    if (iVar2 == 0) {
      pBVar4 = new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                            (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                            (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x104fa8);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr((Btor2Parser *)pBVar4,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"umulo");
    if (iVar2 == 0) {
      pBVar4 = new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                            (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                            (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10507f);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,pBVar4);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"urem");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x105156);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"usubo");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x10522d);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x16:
    iVar2 = strcmp(__s1,"write");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_ternary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x105309);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x17:
    iVar2 = strcmp(__s1,"xnor");
    if (iVar2 == 0) {
      new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                   (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                   (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1053e5);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0),
         iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
    iVar2 = strcmp(__s1,"xor");
    if (iVar2 == 0) {
      pBVar4 = new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                            (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                            (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_binary_op_bfr((Btor2Parser *)pBVar3,(Btor2Line *)0x1054bc);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)in_stack_fffffffffffffdb0,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr((Btor2Parser *)pBVar4,in_stack_fffffffffffffdb0), iVar1 != 0)
         ) {
        return 1;
      }
      return 0;
    }
    break;
  case (Btor2Line *)0x19:
    iVar2 = strcmp(__s1,"zero");
    if (iVar2 == 0) {
      pBVar4 = new_line_bfr(in_stack_fffffffffffffdd0,(int64_t)in_stack_fffffffffffffdc8,
                            (int64_t)in_stack_fffffffffffffdc0,(char *)in_stack_fffffffffffffdb8,
                            (Btor2Tag)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
      iVar1 = parse_constant_bfr(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      if (iVar1 == 0) {
        return 0;
      }
      pusht_bfr((Btor2Parser *)pBVar4,pBVar3);
      iVar1 = check_sorts_bfr(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      if ((iVar1 != 0) &&
         (iVar1 = parse_opt_symbol_bfr(in_stack_fffffffffffffdb8,pBVar4), iVar1 != 0)) {
        return 1;
      }
      return 0;
    }
  }
  iVar1 = perr_bfr(in_RDI,"invalid tag \'%s\'",__s1);
  return iVar1;
}

Assistant:

static int32_t
readl_bfr (Btor2Parser *bfr)
{
  const char *tag;
  int64_t lineno;
  int64_t id;
  int32_t ch;
START:
  // skip white spaces at the beginning of the line
  while ((ch = getc_bfr (bfr)) == ' ')
    ;
  if (ch == EOF) return 0;
  if (ch == '\n') goto START;
  if (ch == '\t')
    return perr_bfr (bfr, "unexpected tab character at start of line");
  if (ch == ';')
  {
    if (!skip_comment (bfr)) return 0;
    goto START;
  }
  ungetc_bfr (bfr, ch);
  if (!parse_id_bfr (bfr, &id)) return 0;
  if (getc_bfr (bfr) != ' ') return perr_bfr (bfr, "expected space after id");
  if (id < bfr->ntable)
  {
    if (id2line_bfr (bfr, id) != 0) return perr_bfr (bfr, "id already defined");
    return perr_bfr (bfr, "id out-of-order");
  }
  lineno = bfr->lineno;
  tag    = parse_tag (bfr);
  if (!tag) return 0;
  switch (tag[0])
  {
    case 'a':
      PARSE (add, binary_op);
      PARSE (and, binary_op);
      break;
    case 'b': PARSE (bad, constraint); break;
    case 'c':
      PARSE (constraint, constraint);
      PARSE (concat, binary_op);
      PARSE (const, constant);
      PARSE (constd, constant);
      PARSE (consth, constant);
      break;
    case 'd': PARSE (dec, unary_op); break;
    case 'e': PARSE (eq, binary_op); break;
    case 'f': PARSE (fair, constraint); break;
    case 'i':
      PARSE (implies, binary_op);
      PARSE (iff, binary_op);
      PARSE (inc, unary_op);
      PARSE (init, init);
      PARSE (input, input);
      PARSE (ite, ternary_op);
      break;
    case 'j': PARSE (justice, justice); break;
    case 'm': PARSE (mul, binary_op); break;
    case 'n':
      PARSE (nand, binary_op);
      PARSE (neq, binary_op);
      PARSE (neg, unary_op);
      PARSE (next, next);
      PARSE (nor, binary_op);
      PARSE (not, unary_op);
      break;
    case 'o':
      PARSE (one, constant);
      PARSE (ones, constant);
      PARSE (or, binary_op);
      PARSE (output, constraint);
      break;
    case 'r':
      PARSE (read, binary_op);
      PARSE (redand, unary_op);
      PARSE (redor, unary_op);
      PARSE (redxor, unary_op);
      PARSE (rol, binary_op);
      PARSE (ror, binary_op);
      break;
    case 's':
      PARSE (saddo, binary_op);
      PARSE (sext, ext);
      PARSE (sgt, binary_op);
      PARSE (sgte, binary_op);
      PARSE (sdiv, binary_op);
      PARSE (sdivo, binary_op);
      PARSE (slice, slice);
      PARSE (sll, binary_op);
      PARSE (slt, binary_op);
      PARSE (slte, binary_op);
      PARSE (sort, sort);
      PARSE (smod, binary_op);
      PARSE (smulo, binary_op);
      PARSE (ssubo, binary_op);
      PARSE (sra, binary_op);
      PARSE (srl, binary_op);
      PARSE (srem, binary_op);
      PARSE (state, input);
      PARSE (sub, binary_op);
      break;
    case 'u':
      PARSE (uaddo, binary_op);
      PARSE (udiv, binary_op);
      PARSE (uext, ext);
      PARSE (ugt, binary_op);
      PARSE (ugte, binary_op);
      PARSE (ult, binary_op);
      PARSE (ulte, binary_op);
      PARSE (umulo, binary_op);
      PARSE (urem, binary_op);
      PARSE (usubo, binary_op);
      break;
    case 'w': PARSE (write, ternary_op); break;
    case 'x':
      PARSE (xnor, binary_op);
      PARSE (xor, binary_op);
      break;
    case 'z': PARSE (zero, constant); break;
  }
  return perr_bfr (bfr, "invalid tag '%s'", tag);
}